

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

essentials_t *
opengv::relative_pose::sevenpt
          (essentials_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *this;
  Index IVar24;
  int iVar25;
  long lVar26;
  undefined8 *puVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ActualDstType actualDst;
  ulong uVar31;
  iterator iVar32;
  ulong uVar33;
  int iVar34;
  size_t sVar35;
  Index size;
  undefined1 auVar36 [16];
  XprTypeNested pMVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  essential_t F1;
  essential_t F2;
  MatrixXd A;
  MatrixXd F2_temp;
  MatrixXd F1_temp;
  Matrix<std::complex<double>,_3,_1,_0,_3,_1> D;
  Matrix<double,_9,_1,_0,_9,_1> f2;
  Matrix<double,_9,_1,_0,_9,_1> f1;
  essential_t M;
  bearingVector_t f1_1;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  Matrix<double,_3,_3,_0,_3,_3> local_708;
  long local_6b8;
  double *local_6b0;
  undefined1 local_6a8 [24];
  double dStack_690;
  undefined1 auStack_688 [16];
  undefined1 auStack_678 [16];
  double local_668;
  Matrix<double,_3,_3,_0,_3,_3> local_658;
  DenseStorage<double,__1,__1,__1,_0> local_608;
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *local_5e8;
  size_t local_5e0;
  DenseStorage<double,__1,__1,__1,_0> local_5d8;
  DenseStorage<double,__1,__1,__1,_0> local_5b8;
  double local_598;
  ulong uStack_590;
  double dStack_588;
  ulong uStack_580;
  double local_578;
  ulong local_570;
  double local_568 [4];
  double local_548;
  double dStack_540;
  double local_538 [4];
  double local_518 [4];
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_4d0 [72];
  undefined1 local_488 [40];
  double local_460;
  undefined1 local_458 [16];
  double local_448;
  undefined1 *local_440;
  double local_438;
  ulong uStack_430;
  undefined2 uStack_428;
  undefined6 uStack_426;
  undefined2 uStack_420;
  undefined6 uStack_41e;
  undefined2 uStack_418;
  undefined6 uStack_416;
  undefined2 uStack_410;
  undefined6 uStack_40e;
  undefined2 uStack_408;
  undefined1 local_2d0;
  undefined2 local_2c4;
  undefined8 local_2c0;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_250;
  
  sVar35 = indices->_numberCorrespondences;
  local_608.m_data = (double *)0x0;
  local_608.m_rows = 0;
  local_608.m_cols = 0;
  if (0xe38e38e38e38e38 < (long)sVar35) {
    puVar27 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar27 = acos;
    __cxa_throw(puVar27,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_5e8 = (vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
               *)__return_storage_ptr__;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_608,sVar35 * 9,sVar35,9);
  local_5e0 = sVar35;
  if (sVar35 != 0) {
    lVar29 = 0;
    sVar35 = 0;
    do {
      iVar34 = (int)sVar35;
      iVar25 = iVar34;
      if (indices->_useIndices != false) {
        iVar25 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar29 >> 0x1e));
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(local_488,adapter,(long)iVar25);
      if (indices->_useIndices != false) {
        iVar34 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar29 >> 0x1e));
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_250,adapter,(long)iVar34);
      local_608.m_data[sVar35] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data * (double)local_488._0_8_;
      local_608.m_data[sVar35 + local_608.m_rows] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data * (double)local_488._8_8_;
      local_608.m_data[sVar35 + local_608.m_rows * 2] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data * (double)local_488._16_8_;
      local_608.m_data[sVar35 + local_608.m_rows * 3] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * (double)local_488._0_8_;
      local_608.m_data[sVar35 + local_608.m_rows * 4] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * (double)local_488._8_8_;
      local_608.m_data[sVar35 + local_608.m_rows * 5] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * (double)local_488._16_8_;
      local_608.m_data[sVar35 + local_608.m_rows * 6] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols * (double)local_488._0_8_;
      local_608.m_data[sVar35 + local_608.m_rows * 7] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols * (double)local_488._8_8_;
      local_608.m_data[sVar35 + local_608.m_rows * 8] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols * (double)local_488._16_8_;
      sVar35 = sVar35 + 1;
      lVar29 = lVar29 + 0x100000000;
    } while (local_5e0 != sVar35);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_250,(MatrixType *)&local_608,0x14);
  local_518[0] = local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 8];
  local_518[1] = (local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 8)[1];
  local_518[2] = local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 8 + 2];
  local_518[3] = (local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 8 + 2)[1];
  local_4f8 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_250.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 8 + 4];
  dStack_4f0 = (local_250.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data +
               local_250.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 8 + 4)[1];
  local_4e8 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_250.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 8 + 6];
  dStack_4e0 = (local_250.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data +
               local_250.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 8 + 6)[1];
  local_4d8 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_250.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 8 + 8];
  local_568[0] = local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 7];
  local_568[1] = (local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 7)[1];
  local_568[2] = local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 7 + 2];
  local_568[3] = (local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 7 + 2)[1];
  local_548 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_250.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 7 + 4];
  dStack_540 = (local_250.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data +
               local_250.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 7 + 4)[1];
  local_538[0] = local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 7 + 6];
  local_538[1] = (local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 7 + 6)[1];
  local_538[2] = local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 7 + 8];
  local_5b8.m_data = (double *)0x0;
  local_5b8.m_rows = 0;
  local_5b8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_5b8,9,3,3);
  IVar24 = local_5b8.m_rows;
  pdVar2 = local_5b8.m_data;
  uVar30 = local_5b8.m_rows;
  if ((((ulong)local_5b8.m_data & 7) == 0) &&
     (uVar30 = (ulong)(-((uint)((ulong)local_5b8.m_data >> 3) & 0x1fffffff) & 7),
     local_5b8.m_rows <= (long)uVar30)) {
    uVar30 = local_5b8.m_rows;
  }
  uVar31 = local_5b8.m_rows - uVar30;
  uVar33 = uVar31 + 7;
  if (-1 < (long)uVar31) {
    uVar33 = uVar31;
  }
  if (0 < (long)uVar30) {
    memcpy(local_5b8.m_data,local_518,uVar30 * 8);
  }
  lVar29 = (uVar33 & 0xfffffffffffffff8) + uVar30;
  if (7 < (long)uVar31) {
    lVar26 = uVar30 + 8;
    if ((long)(uVar30 + 8) < lVar29) {
      lVar26 = lVar29;
    }
    memcpy(pdVar2 + uVar30,local_518 + uVar30,(~uVar30 + lVar26 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar29 < IVar24) {
    memcpy(pdVar2 + uVar30 + ((long)uVar33 >> 3) * 8,local_518 + uVar30 + ((long)uVar33 >> 3) * 8,
           (IVar24 - lVar29) * 8);
  }
  pdVar1 = pdVar2 + IVar24;
  uVar30 = IVar24;
  if ((((ulong)pdVar1 & 7) == 0) &&
     (uVar30 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), IVar24 <= (long)uVar30)) {
    uVar30 = IVar24;
  }
  uVar31 = IVar24 - uVar30;
  uVar33 = uVar31 + 7;
  if (-1 < (long)uVar31) {
    uVar33 = uVar31;
  }
  if (0 < (long)uVar30) {
    memcpy(pdVar1,local_518 + 3,uVar30 * 8);
  }
  lVar29 = (uVar33 & 0xfffffffffffffff8) + uVar30;
  if (7 < (long)uVar31) {
    lVar26 = uVar30 + 8;
    if ((long)(uVar30 + 8) < lVar29) {
      lVar26 = lVar29;
    }
    memcpy(pdVar2 + uVar30 + IVar24,local_518 + uVar30 + 3,
           (~uVar30 + lVar26 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar29 < IVar24) {
    memcpy(pdVar2 + uVar30 + ((long)uVar33 >> 3) * 8 + IVar24,
           local_518 + uVar30 + ((long)uVar33 >> 3) * 8 + 3,(IVar24 - lVar29) * 8);
  }
  local_6b8 = IVar24 * 0x10;
  local_6b0 = pdVar2;
  pdVar2 = pdVar2 + IVar24 * 2;
  uVar30 = IVar24;
  if ((((ulong)pdVar2 & 7) == 0) &&
     (uVar30 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), IVar24 <= (long)uVar30)) {
    uVar30 = IVar24;
  }
  uVar31 = IVar24 - uVar30;
  uVar33 = uVar31 + 7;
  if (-1 < (long)uVar31) {
    uVar33 = uVar31;
  }
  if (0 < (long)uVar30) {
    memcpy(pdVar2,&local_4e8,uVar30 * 8);
  }
  lVar29 = (uVar33 & 0xfffffffffffffff8) + uVar30;
  if (7 < (long)uVar31) {
    lVar26 = uVar30 + 8;
    if ((long)(uVar30 + 8) < lVar29) {
      lVar26 = lVar29;
    }
    memcpy(pdVar2 + uVar30,&local_4e8 + uVar30,(~uVar30 + lVar26 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  pdVar1 = local_6b0;
  if (lVar29 < IVar24) {
    memcpy(pdVar2 + ((long)uVar33 >> 3) * 8 + uVar30,&local_4e8 + ((long)uVar33 >> 3) * 8 + uVar30,
           (IVar24 - lVar29) * 8);
  }
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       *pdVar1;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       pdVar1[IVar24];
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)((long)pdVar1 + local_6b8);
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       pdVar1[1];
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       pdVar1[IVar24 + 1];
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)((long)pdVar1 + local_6b8 + 8);
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       pdVar1[2];
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       pdVar1[IVar24 + 2];
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)((long)pdVar1 + local_6b8 + 0x10);
  local_5d8.m_data = (double *)0x0;
  local_5d8.m_rows = 0;
  local_5d8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_5d8,9,3,3);
  IVar24 = local_5d8.m_rows;
  pdVar2 = local_5d8.m_data;
  uVar30 = local_5d8.m_rows;
  if ((((ulong)local_5d8.m_data & 7) == 0) &&
     (uVar30 = (ulong)(-((uint)((ulong)local_5d8.m_data >> 3) & 0x1fffffff) & 7),
     local_5d8.m_rows <= (long)uVar30)) {
    uVar30 = local_5d8.m_rows;
  }
  uVar31 = local_5d8.m_rows - uVar30;
  uVar33 = uVar31 + 7;
  if (-1 < (long)uVar31) {
    uVar33 = uVar31;
  }
  if (0 < (long)uVar30) {
    memcpy(local_5d8.m_data,local_568,uVar30 * 8);
  }
  lVar29 = (uVar33 & 0xfffffffffffffff8) + uVar30;
  if (7 < (long)uVar31) {
    lVar26 = uVar30 + 8;
    if ((long)(uVar30 + 8) < lVar29) {
      lVar26 = lVar29;
    }
    memcpy(pdVar2 + uVar30,local_568 + uVar30,(~uVar30 + lVar26 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar29 < IVar24) {
    memcpy(pdVar2 + uVar30 + ((long)uVar33 >> 3) * 8,local_568 + uVar30 + ((long)uVar33 >> 3) * 8,
           (IVar24 - lVar29) * 8);
  }
  pdVar1 = pdVar2 + IVar24;
  uVar30 = IVar24;
  if ((((ulong)pdVar1 & 7) == 0) &&
     (uVar30 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), IVar24 <= (long)uVar30)) {
    uVar30 = IVar24;
  }
  uVar31 = IVar24 - uVar30;
  uVar33 = uVar31 + 7;
  if (-1 < (long)uVar31) {
    uVar33 = uVar31;
  }
  if (0 < (long)uVar30) {
    memcpy(pdVar1,local_568 + 3,uVar30 * 8);
  }
  lVar29 = (uVar33 & 0xfffffffffffffff8) + uVar30;
  if (7 < (long)uVar31) {
    lVar26 = uVar30 + 8;
    if ((long)(uVar30 + 8) < lVar29) {
      lVar26 = lVar29;
    }
    memcpy(pdVar2 + uVar30 + IVar24,local_568 + uVar30 + 3,
           (~uVar30 + lVar26 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar29 < IVar24) {
    memcpy(pdVar2 + uVar30 + ((long)uVar33 >> 3) * 8 + IVar24,
           local_568 + uVar30 + ((long)uVar33 >> 3) * 8 + 3,(IVar24 - lVar29) * 8);
  }
  local_6b8 = IVar24 * 0x10;
  local_6b0 = pdVar2;
  pdVar2 = pdVar2 + IVar24 * 2;
  uVar30 = IVar24;
  if ((((ulong)pdVar2 & 7) == 0) &&
     (uVar30 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), IVar24 <= (long)uVar30)) {
    uVar30 = IVar24;
  }
  uVar31 = IVar24 - uVar30;
  uVar33 = uVar31 + 7;
  if (-1 < (long)uVar31) {
    uVar33 = uVar31;
  }
  if (0 < (long)uVar30) {
    memcpy(pdVar2,local_538,uVar30 * 8);
  }
  lVar29 = (uVar33 & 0xfffffffffffffff8) + uVar30;
  if (7 < (long)uVar31) {
    lVar26 = uVar30 + 8;
    if ((long)(uVar30 + 8) < lVar29) {
      lVar26 = lVar29;
    }
    memcpy(pdVar2 + uVar30,local_538 + uVar30,(~uVar30 + lVar26 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  pdVar1 = local_6b0;
  if (lVar29 < IVar24) {
    memcpy(pdVar2 + ((long)uVar33 >> 3) * 8 + uVar30,local_538 + ((long)uVar33 >> 3) * 8 + uVar30,
           (IVar24 - lVar29) * 8);
  }
  this = local_5e8;
  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       *pdVar1;
  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       pdVar1[IVar24];
  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)((long)pdVar1 + local_6b8);
  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       pdVar1[1];
  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       pdVar1[IVar24 + 1];
  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)((long)pdVar1 + local_6b8 + 8);
  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       pdVar1[2];
  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       pdVar1[IVar24 + 2];
  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)((long)pdVar1 + local_6b8 + 0x10);
  *(undefined8 *)local_5e8 = 0;
  *(undefined8 *)(local_5e8 + 8) = 0;
  *(undefined8 *)(local_5e8 + 0x10) = 0;
  if (local_5e0 < 8) {
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar48._8_8_ = 0;
    auVar48._0_8_ =
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar68._8_8_ = 0;
    auVar68._0_8_ =
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar70._8_8_ = 0;
    auVar70._0_8_ =
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar36 = vfmsub231sd_fma(auVar70,auVar36,auVar48);
    auVar71._8_8_ = 0;
    auVar71._0_8_ =
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar66._8_8_ = 0;
    auVar66._0_8_ =
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar48 = vfmsub231sd_fma(auVar66,auVar71,auVar48);
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar38 = vfmsub231sd_fma(auVar38,auVar71,auVar68);
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         auVar38._0_8_ *
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         (auVar36._0_8_ *
          local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] -
         auVar48._0_8_ *
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3]);
    auVar36 = vandpd_avx512vl(auVar39,auVar3);
    if (auVar36._0_8_ < 1e-08) goto LAB_00131365;
    local_6a8._0_8_ = &local_658;
    local_6a8._8_8_ = &local_708;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_3,_3,_0,_3,_3> *)local_488,(SrcXprType *)local_6a8,
          (assign_op<double,_double> *)&local_598);
    local_440 = (undefined1 *)local_6a8._8_8_;
    auVar23._8_8_ = local_488._8_8_;
    auVar23._0_8_ = local_488._0_8_;
    lVar29 = 0x10;
    do {
      auVar4._8_8_ = *(undefined8 *)(local_6a8._8_8_ + lVar29 + -0x10);
      auVar4._0_8_ = *(undefined8 *)(local_6a8._8_8_ + lVar29 + -0x10);
      auVar36 = vmulpd_avx512vl(auVar23,auVar4);
      auVar5._8_8_ = *(undefined8 *)(local_6a8._8_8_ + lVar29 + -8);
      auVar5._0_8_ = *(undefined8 *)(local_6a8._8_8_ + lVar29 + -8);
      auVar36 = vfmadd231pd_avx512vl(auVar36,local_488._24_16_,auVar5);
      auVar6._8_8_ = *(undefined8 *)(local_6a8._8_8_ + lVar29);
      auVar6._0_8_ = *(undefined8 *)(local_6a8._8_8_ + lVar29);
      auVar36 = vfmadd231pd_avx512vl(auVar36,local_458,auVar6);
      *(undefined1 (*) [16])((long)&dStack_4e0 + lVar29) = auVar36;
      *(double *)(local_4d0 + lVar29) =
           (double)local_488._16_8_ * *(double *)(local_6a8._8_8_ + lVar29 + -0x10) +
           local_448 * *(double *)(local_6a8._8_8_ + lVar29) +
           local_460 * *(double *)(local_6a8._8_8_ + lVar29 + -8);
      lVar29 = lVar29 + 0x18;
    } while (lVar29 != 0x58);
    local_2d0 = 0;
    local_2c4 = 0;
    local_438 = 0.0;
    uStack_430 = 0;
    uStack_428 = 0;
    uStack_426 = 0;
    uStack_420 = 0;
    uStack_41e = 0;
    uStack_418 = 0;
    uStack_416 = 0;
    uStack_410 = 0;
    uStack_40e = 0;
    uStack_408 = 0;
    local_2c0 = 0xffffffffffffffff;
    Eigen::EigenSolver<Eigen::Matrix<double,3,3,0,3,3>>::compute<Eigen::Matrix<double,3,3,0,3,3>>
              ((EigenSolver<Eigen::Matrix<double,3,3,0,3,3>> *)local_488,local_4d0,true);
    local_598 = local_438;
    uStack_590 = uStack_430;
    dStack_588 = (double)CONCAT62(uStack_426,uStack_428);
    uStack_580 = CONCAT62(uStack_41e,uStack_420);
    local_578 = (double)CONCAT62(uStack_416,uStack_418);
    local_570 = CONCAT62(uStack_40e,uStack_410);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uStack_430;
    auVar67._8_8_ = 0x7fffffffffffffff;
    auVar67._0_8_ = 0x7fffffffffffffff;
    auVar36 = vandpd_avx(auVar40,auVar67);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = CONCAT62(uStack_41e,uStack_420);
    auVar48 = vandpd_avx(auVar49,auVar67);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = CONCAT62(uStack_40e,uStack_410);
    auVar38 = vandpd_avx(auVar69,auVar67);
    if (((1e-08 <= auVar36._0_8_) || (1e-08 <= auVar48._0_8_)) || (1e-08 <= auVar38._0_8_)) {
      auVar3 = vminsd_avx(auVar48,auVar36);
      uVar28 = 2;
      if (auVar3._0_8_ <= auVar38._0_8_) {
        uVar28 = (uint)(auVar48._0_8_ < auVar36._0_8_);
      }
      dVar41 = *(double *)((long)&local_598 + (ulong)(uVar28 << 4));
      auVar54._0_8_ =
           dVar41 * local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0];
      auVar54._8_8_ =
           dVar41 * local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1];
      auVar8._8_8_ = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1];
      auVar8._0_8_ = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0];
      local_6a8._0_16_ = vsubpd_avx(auVar8,auVar54);
      auVar12._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar12._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar16._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar16._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar20._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar20._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar55._0_8_ =
           dVar41 * local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[2];
      auVar55._8_8_ =
           dVar41 * local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[3];
      unique0x00105800 = vsubpd_avx(auVar12,auVar55);
      auVar56._0_8_ =
           dVar41 * local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[4];
      auVar56._8_8_ =
           dVar41 * local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[5];
      auStack_688 = vsubpd_avx(auVar16,auVar56);
      auVar57._0_8_ =
           dVar41 * local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[6];
      auVar57._8_8_ =
           dVar41 * local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[7];
      auStack_678 = vsubpd_avx(auVar20,auVar57);
      local_668 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8] -
                  dVar41 * local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[8];
      iVar32._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8);
      if (iVar32._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 0x10)) {
        std::
        vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>>
                  (this,iVar32,(Matrix<double,_3,_3,_0,_3,_3> *)local_6a8);
        goto LAB_00131605;
      }
    }
    else {
      auVar50._0_8_ =
           local_438 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar50._8_8_ =
           local_438 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar7._8_8_ = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1];
      auVar7._0_8_ = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0];
      local_6a8._0_16_ = vsubpd_avx(auVar7,auVar50);
      auVar11._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar11._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar15._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar15._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar19._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar19._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar51._0_8_ =
           local_438 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar51._8_8_ =
           local_438 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      unique0x00105800 = vsubpd_avx(auVar11,auVar51);
      auVar52._0_8_ =
           local_438 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar52._8_8_ =
           local_438 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auStack_688 = vsubpd_avx(auVar15,auVar52);
      auVar53._0_8_ =
           local_438 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar53._8_8_ =
           local_438 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auStack_678 = vsubpd_avx(auVar19,auVar53);
      local_668 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8] -
                  local_438 *
                  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8];
      iVar32._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8);
      if (iVar32._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 0x10)) {
        std::
        vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>>
                  (this,iVar32,(Matrix<double,_3,_3,_0,_3,_3> *)local_6a8);
      }
      else {
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[8] = local_668;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[0] = (double)local_6a8._0_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[1] = (double)local_6a8._8_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[2] = (double)local_6a8._16_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[3] = dStack_690;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[4] = (double)auStack_688._0_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[5] = (double)auStack_688._8_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[6] = (double)auStack_678._0_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[7] = (double)auStack_678._8_8_;
        *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8) = iVar32._M_current + 1;
      }
      auVar58._0_8_ =
           dStack_588 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar58._8_8_ =
           dStack_588 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar9._8_8_ = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1];
      auVar9._0_8_ = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0];
      local_6a8._0_16_ = vsubpd_avx(auVar9,auVar58);
      auVar13._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar13._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar17._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar17._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar21._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar21._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar59._0_8_ =
           dStack_588 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar59._8_8_ =
           dStack_588 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      unique0x00105800 = vsubpd_avx(auVar13,auVar59);
      auVar60._0_8_ =
           dStack_588 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar60._8_8_ =
           dStack_588 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auStack_688 = vsubpd_avx(auVar17,auVar60);
      auVar61._0_8_ =
           dStack_588 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar61._8_8_ =
           dStack_588 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auStack_678 = vsubpd_avx(auVar21,auVar61);
      local_668 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8] -
                  dStack_588 *
                  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8];
      iVar32._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8);
      if (iVar32._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 0x10)) {
        std::
        vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>>
                  (this,iVar32,(Matrix<double,_3,_3,_0,_3,_3> *)local_6a8);
      }
      else {
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[8] = local_668;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[0] = (double)local_6a8._0_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[1] = (double)local_6a8._8_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[2] = (double)local_6a8._16_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[3] = dStack_690;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[4] = (double)auStack_688._0_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[5] = (double)auStack_688._8_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[6] = (double)auStack_678._0_8_;
        ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[7] = (double)auStack_678._8_8_;
        *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8) = iVar32._M_current + 1;
      }
      auVar62._0_8_ =
           local_578 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      auVar62._8_8_ =
           local_578 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar10._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      auVar10._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      local_6a8._0_16_ = vsubpd_avx(auVar10,auVar62);
      auVar14._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      auVar14._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar18._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auVar18._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar22._8_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auVar22._0_8_ =
           local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar63._0_8_ =
           local_578 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      auVar63._8_8_ =
           local_578 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      unique0x00105800 = vsubpd_avx(auVar14,auVar63);
      auVar64._0_8_ =
           local_578 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      auVar64._8_8_ =
           local_578 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      auStack_688 = vsubpd_avx(auVar18,auVar64);
      auVar65._0_8_ =
           local_578 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      auVar65._8_8_ =
           local_578 *
           local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      auStack_678 = vsubpd_avx(auVar22,auVar65);
      local_668 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8] -
                  local_578 *
                  local_658.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8];
      iVar32._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8);
      if (iVar32._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 0x10)) {
        std::
        vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>>
                  (this,iVar32,(Matrix<double,_3,_3,_0,_3,_3> *)local_6a8);
        goto LAB_00131605;
      }
    }
    ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
    m_data.array[8] = local_668;
    pMVar37 = (XprTypeNested)local_6a8._0_8_;
    dVar41 = (double)local_6a8._8_8_;
    dVar42 = (double)local_6a8._16_8_;
    dVar43 = dStack_690;
    dVar44 = (double)auStack_688._0_8_;
    dVar45 = (double)auStack_688._8_8_;
    dVar46 = (double)auStack_678._0_8_;
    dVar47 = (double)auStack_678._8_8_;
  }
  else {
LAB_00131365:
    iVar32._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(local_5e8 + 8);
    if (iVar32._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(local_5e8 + 0x10)) {
      std::
      vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>(local_5e8,iVar32,&local_708);
      goto LAB_00131605;
    }
    ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
    m_data.array[8] =
         local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    pMVar37 = (XprTypeNested)
              local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0];
    dVar41 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1];
    dVar42 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2];
    dVar43 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3];
    dVar44 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
    dVar45 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5];
    dVar46 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6];
    dVar47 = local_708.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  }
  ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = (double)pMVar37;
  ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] = dVar41;
  ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar42;
  ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar43;
  ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = dVar44;
  ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar45;
  ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar46;
  ((iVar32._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar47;
  *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8) = iVar32._M_current + 1;
LAB_00131605:
  if (local_5d8.m_data != (double *)0x0) {
    free((void *)local_5d8.m_data[-1]);
  }
  if (local_5b8.m_data != (double *)0x0) {
    free((void *)local_5b8.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_250);
  if (local_608.m_data != (double *)0x0) {
    free((void *)local_608.m_data[-1]);
  }
  return (essentials_t *)this;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::twopt_rotationOnly(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  assert(indices.size() > 1);
  return twopt_rotationOnly( adapter, indices[0], indices[1] );
}